

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O1

void henson_load_array(char *name,void **address,size_t *type,size_t *count,size_t *stride)

{
  NameMap *this;
  void *pvVar1;
  allocator local_c9;
  string local_c8;
  data_t local_a8;
  undefined8 uStack_a0;
  size_t local_98;
  size_t sStack_90;
  size_t local_88;
  undefined8 local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_78;
  data_t local_68;
  int local_30;
  
  this = namemap;
  if (namemap != (NameMap *)0x0) {
    std::__cxx11::string::string((string *)&local_c8,name,&local_c9);
    henson::NameMap::get((Value *)&local_68.head_,this,&local_c8);
    if (local_30 != 5) {
      mpark::throw_bad_variant_access();
    }
    local_88 = local_68._32_8_;
    local_98 = local_68._16_8_;
    sStack_90 = local_68._24_8_;
    local_a8 = (data_t)local_68.tail_._0_8_;
    uStack_a0 = local_68._8_8_;
    local_80 = local_68._40_8_;
    p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._48_8_;
    local_68._40_8_ = 0;
    local_68._48_8_ = 0;
    mpark::detail::
    destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
    ::~destructor((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                   *)&local_68.head_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    pvVar1 = henson::Array::void_ptr((Array *)&local_a8.head_);
    *address = pvVar1;
    *type = local_98;
    *count = sStack_90;
    *stride = local_88;
    if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
    }
  }
  return;
}

Assistant:

void
henson_load_array(const char* name, void** address, size_t* type, size_t* count, size_t* stride)
{
    if (!namemap) return;

    henson::Array a = henson::get<henson::Array>(namemap->get(name));
    *address = a.void_ptr();
    *type    = a.type;
    *count   = a.count;
    *stride  = a.stride;
}